

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.cpp
# Opt level: O2

void __thiscall duckdb::BaseExpression::Print(BaseExpression *this)

{
  string sStack_28;
  
  (*this->_vptr_BaseExpression[8])(&sStack_28,this);
  Printer::Print(&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void BaseExpression::Print() const {
	Printer::Print(ToString());
}